

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprToRegister(Expr *pExpr,int iReg)

{
  uint uVar1;
  u8 uVar2;
  ExprList_item *pEVar3;
  
  while( true ) {
    if (pExpr == (Expr *)0x0) {
      return;
    }
    uVar1 = pExpr->flags;
    if ((uVar1 & 0x82000) == 0) break;
    if ((uVar1 >> 0x13 & 1) == 0) {
      uVar2 = pExpr->op;
      if (uVar2 != 'r') goto LAB_0017ad5a;
      pEVar3 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar3 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar3->pExpr;
  }
  uVar2 = pExpr->op;
LAB_0017ad5a:
  if (uVar2 == 0xb0) {
    return;
  }
  pExpr->op2 = uVar2;
  pExpr->op = 0xb0;
  pExpr->iTable = iReg;
  pExpr->flags = uVar1 & 0xffffdfff;
  return;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSkipCollateAndLikely(Expr *pExpr){
  while( pExpr && ExprHasProperty(pExpr, EP_Skip|EP_Unlikely) ){
    if( ExprHasProperty(pExpr, EP_Unlikely) ){
      assert( ExprUseXList(pExpr) );
      assert( pExpr->x.pList->nExpr>0 );
      assert( pExpr->op==TK_FUNCTION );
      pExpr = pExpr->x.pList->a[0].pExpr;
    }else if( pExpr->op==TK_COLLATE ){
      pExpr = pExpr->pLeft;
    }else{
      break;
    }
  }
  return pExpr;
}